

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVector<llvm::SMFixIt,_4U>::~SmallVector(SmallVector<llvm::SMFixIt,_4U> *this)

{
  long *plVar1;
  void *pvVar2;
  long *plVar3;
  undefined1 *__ptr;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(this->super_SmallVectorImpl<llvm::SMFixIt>).
                 super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                 super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  if (uVar4 != 0) {
    pvVar2 = (this->super_SmallVectorImpl<llvm::SMFixIt>).
             super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
             super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
    lVar5 = uVar4 * 0x30;
    do {
      plVar1 = (long *)((long)pvVar2 + lVar5 + -0x10);
      plVar3 = *(long **)((long)pvVar2 + lVar5 + -0x20);
      if (plVar1 != plVar3) {
        operator_delete(plVar3,*plVar1 + 1);
      }
      lVar5 = lVar5 + -0x30;
    } while (lVar5 != 0);
  }
  __ptr = (undefined1 *)
          (this->super_SmallVectorImpl<llvm::SMFixIt>).
          super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
          super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  if ((SmallVectorStorage<llvm::SMFixIt,_4U> *)__ptr !=
      &this->super_SmallVectorStorage<llvm::SMFixIt,_4U>) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }